

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O3

MemTxResult
access_with_adjusted_size
          (uc_struct_conflict15 *uc,hwaddr addr,uint64_t *value,uint size,uint access_size_min,
          uint access_size_max,
          _func_MemTxResult_uc_struct_ptr_MemoryRegion_ptr_hwaddr_uint64_t_ptr_uint_int_uint64_t_MemTxAttrs_conflict14
          *access_fn,MemoryRegion_conflict *mr,MemTxAttrs attrs)

{
  MemTxResult MVar1;
  hwaddr hVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  
  uVar7 = 4;
  if (access_size_max != 0) {
    uVar7 = access_size_max;
  }
  if (size <= uVar7) {
    uVar7 = size;
  }
  if (uVar7 < access_size_min) {
    uVar7 = access_size_min;
  }
  uVar7 = uVar7 + (uVar7 == 0);
  uVar6 = 0xffffffffffffffff >> (-(char)(uVar7 * 8) & 0x3fU);
  if (mr->ops->endianness == DEVICE_BIG_ENDIAN) {
    if (size != 0) {
      iVar8 = size * 8 + uVar7 * -8;
      uVar5 = 0;
      uVar4 = 0;
      do {
        hVar2 = uVar4 + addr;
        uVar3 = (int)uVar4 + uVar7;
        uVar4 = (ulong)uVar3;
        MVar1 = (*access_fn)(uc,mr,hVar2,value,uVar7,iVar8,uVar6,attrs);
        uVar5 = uVar5 | MVar1;
        iVar8 = iVar8 + uVar7 * -8;
      } while (uVar3 < size);
      return uVar5;
    }
  }
  else if (size != 0) {
    iVar8 = 0;
    uVar5 = 0;
    uVar4 = 0;
    do {
      MVar1 = (*access_fn)(uc,mr,uVar4 + addr,value,uVar7,iVar8,uVar6,attrs);
      uVar5 = uVar5 | MVar1;
      uVar3 = (int)uVar4 + uVar7;
      uVar4 = (ulong)uVar3;
      iVar8 = iVar8 + uVar7 * 8;
    } while (uVar3 < size);
    return uVar5;
  }
  return 0;
}

Assistant:

static MemTxResult access_with_adjusted_size(struct uc_struct *uc, hwaddr addr,
                                      uint64_t *value,
                                      unsigned size,
                                      unsigned access_size_min,
                                      unsigned access_size_max,
                                      MemTxResult (*access_fn)
                                                  (struct uc_struct *uc,
                                                   MemoryRegion *mr,
                                                   hwaddr addr,
                                                   uint64_t *value,
                                                   unsigned size,
                                                   signed shift,
                                                   uint64_t mask,
                                                   MemTxAttrs attrs),
                                      MemoryRegion *mr,
                                      MemTxAttrs attrs)
{
    uint64_t access_mask;
    unsigned access_size;
    unsigned i;
    MemTxResult r = MEMTX_OK;

    if (!access_size_min) {
        access_size_min = 1;
    }
    if (!access_size_max) {
        access_size_max = 4;
    }

    /* FIXME: support unaligned access? */
    access_size = MAX(MIN(size, access_size_max), access_size_min);
    access_mask = MAKE_64BIT_MASK(0, access_size * 8);
    if (memory_region_big_endian(mr)) {
        for (i = 0; i < size; i += access_size) {
            r |= access_fn(uc, mr, addr + i, value, access_size,
                        (size - access_size - i) * 8, access_mask, attrs);
        }
    } else {
        for (i = 0; i < size; i += access_size) {
            r |= access_fn(uc, mr, addr + i, value, access_size, i * 8,
                        access_mask, attrs);
        }
    }
    return r;
}